

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

InternalParseResult * __thiscall
Catch::Clara::Detail::ParserBase::parse(ParserBase *this,Args *args)

{
  Args *in_RDX;
  Args *in_RSI;
  InternalParseResult *in_RDI;
  TokenStream *in_stack_ffffffffffffff80;
  undefined1 local_70 [24];
  StringRef *in_stack_ffffffffffffffa8;
  string local_38 [56];
  
  Args::exeName(in_RDX);
  StringRef::operator_cast_to_string(in_stack_ffffffffffffffa8);
  TokenStream::TokenStream(in_stack_ffffffffffffff80,in_RSI);
  (**(code **)((in_RSI->m_exeName).m_start + 0x18))(in_RDI,in_RSI,local_38,local_70);
  TokenStream::~TokenStream((TokenStream *)0x17e9ba);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

InternalParseResult ParserBase::parse( Args const& args ) const {
                return parse( static_cast<std::string>(args.exeName()), TokenStream( args ) );
            }